

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O0

void __thiscall
ExprFunctionContextAccess::ExprFunctionContextAccess
          (ExprFunctionContextAccess *this,SynBase *source,TypeBase *type,FunctionData *function,
          VariableData *contextVariable)

{
  VariableData *contextVariable_local;
  FunctionData *function_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExprFunctionContextAccess *this_local;
  
  ExprBase::ExprBase(&this->super_ExprBase,0x23,source,type);
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprFunctionContextAccess_003080d0;
  this->function = function;
  this->contextVariable = contextVariable;
  if (function == (FunctionData *)0x0) {
    __assert_fail("function",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3b7,
                  "ExprFunctionContextAccess::ExprFunctionContextAccess(SynBase *, TypeBase *, FunctionData *, VariableData *)"
                 );
  }
  if (type == contextVariable->type) {
    if (((contextVariable->lookupOnly ^ 0xffU) & 1) == 0) {
      __assert_fail("!contextVariable->lookupOnly",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x3b9,
                    "ExprFunctionContextAccess::ExprFunctionContextAccess(SynBase *, TypeBase *, FunctionData *, VariableData *)"
                   );
    }
    return;
  }
  __assert_fail("type == contextVariable->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x3b8,
                "ExprFunctionContextAccess::ExprFunctionContextAccess(SynBase *, TypeBase *, FunctionData *, VariableData *)"
               );
}

Assistant:

ExprFunctionContextAccess(SynBase *source, TypeBase *type, FunctionData *function, VariableData *contextVariable): ExprBase(myTypeID, source, type), function(function), contextVariable(contextVariable)
	{
		assert(function);
		assert(type == contextVariable->type);
		assert(!contextVariable->lookupOnly);
	}